

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int SaveEXRImageToFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  FILE *__s;
  size_t __n;
  size_t sVar1;
  uchar *__ptr;
  string *msg;
  int iVar2;
  allocator local_69;
  uchar *mem;
  string local_48;
  
  if ((filename == (char *)0x0 || exr_image == (EXRImage *)0x0) ||
     (exr_header->compression_type < 0)) {
    std::__cxx11::string::string
              ((string *)&local_48,"Invalid argument for SaveEXRImageToFile",(allocator *)&mem);
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = -3;
  }
  else if (exr_header->compression_type == 0x80) {
    std::__cxx11::string::string
              ((string *)&local_48,"ZFP compression is not supported in this build",
               (allocator *)&mem);
    tinyexr::SetErrorMessage(&local_48,err);
    std::__cxx11::string::~string((string *)&local_48);
    iVar2 = -10;
  }
  else {
    __s = fopen(filename,"wb");
    if (__s == (FILE *)0x0) {
      std::__cxx11::string::string((string *)&mem,filename,&local_69);
      std::operator+(&local_48,"Cannot write a file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mem);
      tinyexr::SetErrorMessage(&local_48,err);
      std::__cxx11::string::~string((string *)&local_48);
      msg = (string *)&mem;
    }
    else {
      mem = (uchar *)0x0;
      __n = SaveEXRImageToMemory(exr_image,exr_header,&mem,err);
      if (__n == 0) {
        return -0xc;
      }
      if (mem == (uchar *)0x0) {
        __ptr = (uchar *)0x0;
        sVar1 = 0;
      }
      else {
        sVar1 = fwrite(mem,1,__n,__s);
        __ptr = mem;
      }
      free(__ptr);
      fclose(__s);
      if (sVar1 == __n) {
        return 0;
      }
      msg = &local_48;
      std::__cxx11::string::string((string *)msg,"Cannot write a file",&local_69);
      tinyexr::SetErrorMessage(msg,err);
    }
    std::__cxx11::string::~string((string *)msg);
    iVar2 = -0xb;
  }
  return iVar2;
}

Assistant:

int SaveEXRImageToFile(const EXRImage *exr_image, const EXRHeader *exr_header,
                       const char *filename, const char **err) {
  if (exr_image == NULL || filename == NULL ||
      exr_header->compression_type < 0) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRImageToFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#if !TINYEXR_USE_PIZ
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    tinyexr::SetErrorMessage("PIZ compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

#if !TINYEXR_USE_ZFP
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    tinyexr::SetErrorMessage("ZFP compression is not supported in this build",
                             err);
    return TINYEXR_ERROR_UNSUPPORTED_FEATURE;
  }
#endif

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || defined(__MINGW32__)  // MSVC, MinGW gcc or clang
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRImageToMemory(exr_image, exr_header, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}